

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lif.cpp
# Opt level: O0

bool ReadLIF(MemFile *file,shared_ptr<Disk> *disk)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  string *path;
  element_type *peVar4;
  Data *data;
  FILE *__stream;
  byte local_96;
  allocator<char> local_81;
  undefined1 local_80 [44];
  Format fmt;
  shared_ptr<Disk> *disk_local;
  MemFile *file_local;
  
  __stream = (FILE *)0x1b;
  fmt._52_8_ = disk;
  Format::Format((Format *)(local_80 + 0x24),LIF);
  iVar2 = MemFile::size(file);
  iVar3 = Format::disk_size((Format *)(local_80 + 0x24));
  local_96 = 1;
  if (iVar2 == iVar3) {
    path = MemFile::name_abi_cxx11_(file);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"lif",&local_81);
    __stream = (FILE *)local_80;
    bVar1 = IsFileExt(path,(string *)__stream);
    local_96 = bVar1 ^ 0xff;
    std::__cxx11::string::~string((string *)local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  bVar1 = (local_96 & 1) == 0;
  if (bVar1) {
    MemFile::rewind(file,__stream);
    peVar4 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        fmt._52_8_);
    data = MemFile::data(file);
    Disk::format(peVar4,(Format *)(local_80 + 0x24),data,false);
    peVar4 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        fmt._52_8_);
    std::__cxx11::string::operator=((string *)&peVar4->strType,"LIF");
  }
  return bVar1;
}

Assistant:

bool ReadLIF(MemFile& file, std::shared_ptr<Disk>& disk)
{
    Format fmt{ RegularFormat::LIF };

    // For now, rely on the file size and extension
    if (file.size() != fmt.disk_size() || !IsFileExt(file.name(), "lif"))
        return false;

    file.rewind();
    disk->format(fmt, file.data());
    disk->strType = "LIF";

    return true;
}